

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRendering.cpp
# Opt level: O3

void __thiscall glcts::GeometryShaderLayeredRendering::deinit(GeometryShaderLayeredRendering *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  _layered_rendering_test *p_Var4;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x6a0))(0x8ca9,0x8ce0,0xde1,0,0);
  (**(code **)(lVar2 + 0xb8))(0xde1,0);
  (**(code **)(lVar2 + 0x78))(0x8d40,0);
  (**(code **)(lVar2 + 0xd8))(0);
  p_Var4 = this->m_tests;
  lVar3 = 4;
  do {
    if (p_Var4->po_id != 0) {
      (**(code **)(lVar2 + 0x448))();
    }
    if (p_Var4->fs_id != 0) {
      (**(code **)(lVar2 + 0x470))();
    }
    if (p_Var4->gs_id != 0) {
      (**(code **)(lVar2 + 0x470))();
    }
    if (p_Var4->vs_id != 0) {
      (**(code **)(lVar2 + 0x470))();
    }
    if (p_Var4->to_id != 0) {
      (**(code **)(lVar2 + 0x480))(1,&p_Var4->to_id);
    }
    if (p_Var4->fbo_id != 0) {
      (**(code **)(lVar2 + 0x440))(1,p_Var4);
    }
    p_Var4 = p_Var4 + 1;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderLayeredRendering::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0 /* texture */, 0 /* level */);
	gl.bindTexture(GL_TEXTURE_2D, 0 /* texture */);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.bindVertexArray(0);

	for (unsigned int n_current_test = 0; n_current_test < sizeof(m_tests) / sizeof(m_tests[0]); ++n_current_test)
	{
		if (m_tests[n_current_test].po_id != 0)
		{
			gl.deleteProgram(m_tests[n_current_test].po_id);
		}

		if (m_tests[n_current_test].fs_id != 0)
		{
			gl.deleteShader(m_tests[n_current_test].fs_id);
		}

		if (m_tests[n_current_test].gs_id != 0)
		{
			gl.deleteShader(m_tests[n_current_test].gs_id);
		}

		if (m_tests[n_current_test].vs_id != 0)
		{
			gl.deleteShader(m_tests[n_current_test].vs_id);
		}

		if (m_tests[n_current_test].to_id != 0)
		{
			gl.deleteTextures(1, &m_tests[n_current_test].to_id);
		}

		if (m_tests[n_current_test].fbo_id != 0)
		{
			gl.deleteFramebuffers(1, &m_tests[n_current_test].fbo_id);
		}
	} /* for (all tests) */

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
	}

	/* Release base class */
	TestCaseBase::deinit();
}